

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

RegOpnd * __thiscall
Lowerer::GenerateForInEnumeratorLoad
          (Lowerer *this,Opnd *forInEnumeratorOpnd,Instr *insertBeforeInstr)

{
  int iVar1;
  Func *func;
  code *pcVar2;
  OpndKind OVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  StackSym *pSVar7;
  RegOpnd *dst;
  
  func = insertBeforeInstr->m_func;
  OVar3 = IR::Opnd::GetKind(forInEnumeratorOpnd);
  OVar4 = IR::Opnd::GetKind(forInEnumeratorOpnd);
  if (OVar3 == OpndKindSym) {
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_005da760;
      *puVar6 = 0;
    }
    pSVar7 = IR::Opnd::GetStackSym(forInEnumeratorOpnd);
    if ((pSVar7->field_0x19 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7059,"(!stackSym->m_allocated)","!stackSym->m_allocated");
      if (!bVar5) goto LAB_005da760;
      *puVar6 = 0;
    }
    iVar1 = pSVar7->m_offset;
    if (this->m_func->m_forInLoopMaxDepth <= func->m_forInLoopBaseDepth + iVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x705b,
                         "(func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth)"
                         ,
                         "func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth"
                        );
      if (!bVar5) {
LAB_005da760:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    pSVar7->m_offset =
         (iVar1 + func->m_forInLoopBaseDepth) * 0x58 + this->m_func->m_forInEnumeratorArrayOffset;
    pSVar7->field_0x19 = pSVar7->field_0x19 | 0x10;
  }
  else {
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7061,"(forInEnumeratorOpnd->IsIndirOpnd())",
                         "forInEnumeratorOpnd->IsIndirOpnd()");
      if (!bVar5) goto LAB_005da760;
      *puVar6 = 0;
    }
    OVar3 = IR::Opnd::GetKind(forInEnumeratorOpnd);
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_005da760;
      *puVar6 = 0;
    }
    if (*(int *)&forInEnumeratorOpnd[2]._vptr_Opnd == 0) {
      OVar3 = IR::Opnd::GetKind(forInEnumeratorOpnd);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_005da760;
        *puVar6 = 0;
      }
      return (RegOpnd *)forInEnumeratorOpnd[1]._vptr_Opnd;
    }
  }
  dst = IR::RegOpnd::New(TyUint64,func);
  InsertLea(dst,forInEnumeratorOpnd,insertBeforeInstr);
  return dst;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateForInEnumeratorLoad(IR::Opnd * forInEnumeratorOpnd, IR::Instr * insertBeforeInstr)
{
    Func * func = insertBeforeInstr->m_func;

    if (forInEnumeratorOpnd->IsSymOpnd())
    {
        StackSym * stackSym = forInEnumeratorOpnd->AsSymOpnd()->GetStackSym();
        Assert(!stackSym->m_allocated);
        uint forInLoopLevel = stackSym->m_offset;
        Assert(func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth);
        stackSym->m_offset = this->m_func->m_forInEnumeratorArrayOffset + ((func->m_forInLoopBaseDepth + forInLoopLevel) * sizeof(Js::ForInObjectEnumerator));
        stackSym->m_allocated = true;
    }
    else
    {
        Assert(forInEnumeratorOpnd->IsIndirOpnd());
        if (forInEnumeratorOpnd->AsIndirOpnd()->GetOffset() == 0)
        {
            return forInEnumeratorOpnd->AsIndirOpnd()->GetBaseOpnd();
        }
    }
    IR::RegOpnd * forInEnumeratorRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    InsertLea(forInEnumeratorRegOpnd, forInEnumeratorOpnd, insertBeforeInstr);
    return forInEnumeratorRegOpnd;
}